

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool string_loadat(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  gravity_object_t *pgVar4;
  bool bVar5;
  gravity_range_t *range;
  gravity_fiber_t *pgVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  long lVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  gravity_value_t gVar17;
  char _buffer [4096];
  char acStack_1038 [4104];
  ulong uVar11;
  
  pgVar4 = (args->field_1).p;
  uVar7 = args[1].field_1.n;
  if (args[1].isa == gravity_class_int) {
    uVar15 = uVar7 & 0xffffffff;
  }
  else {
    if (args[1].isa != gravity_class_range) {
      memcpy(acStack_1038,"An integer index or index range is required to access string items.",0x44
            );
      pgVar6 = gravity_vm_fiber(vm);
      gravity_fiber_seterror(pgVar6,acStack_1038);
      goto LAB_001293fb;
    }
    uVar15 = (ulong)*(uint *)(uVar7 + 0x30);
    uVar7 = (ulong)*(uint *)(uVar7 + 0x38);
  }
  uVar2 = *(uint *)((long)&pgVar4->identifier + 4);
  if ((((int)uVar15 < 0) &&
      (uVar14 = (int)uVar15 + uVar2, uVar15 = (ulong)uVar14, uVar11 = uVar15, (int)uVar14 < 0)) ||
     (uVar14 = (uint)uVar15, uVar11 = uVar15, uVar2 <= uVar14)) {
    pcVar8 = "Out of bounds error: first_index %d beyond bounds 0...%d";
  }
  else {
    uVar10 = ((int)uVar7 >> 0x1f & uVar2) + (int)uVar7;
    uVar11 = (ulong)uVar10;
    if ((-1 < (int)uVar10) && (uVar10 < uVar2)) {
      iVar16 = uVar14 - uVar10;
      if (uVar14 < uVar10) {
        iVar16 = uVar10 - uVar14;
      }
      if (uVar14 <= uVar10) {
        gVar17 = gravity_string_to_value
                           (vm,(char *)((long)&pgVar4->objclass->isa + uVar15),iVar16 + 1U);
LAB_00129433:
        gravity_vm_setslot(vm,gVar17,rindex);
        return true;
      }
      pcVar8 = (char *)gravity_calloc(vm,1,(ulong)uVar2);
      if (pcVar8 != (char *)0x0) {
        strncpy(pcVar8,(char *)pgVar4->objclass,(ulong)*(uint *)((long)&pgVar4->identifier + 4));
        iVar3 = *(int *)((long)&pgVar4->identifier + 4);
        if (0 < iVar3 + -1) {
          lVar9 = (long)(iVar3 + -1);
          lVar13 = 0;
          lVar12 = (long)(iVar3 + -2);
          do {
            cVar1 = pcVar8[lVar9];
            pcVar8[lVar9] = pcVar8[lVar13];
            pcVar8[lVar13] = cVar1;
            lVar13 = lVar13 + 1;
            lVar9 = lVar9 + -1;
            bVar5 = lVar13 < lVar12;
            lVar12 = lVar12 + -1;
          } while (bVar5);
        }
        gVar17 = gravity_string_to_value(vm,pcVar8 + (int)(~uVar14 + iVar3),iVar16 + 1U);
        free(pcVar8);
        goto LAB_00129433;
      }
      goto LAB_001293fb;
    }
    pcVar8 = "Out of bounds error: second_index %d beyond bounds 0...%d";
  }
  snprintf(acStack_1038,0x1000,pcVar8,uVar11,(ulong)(uVar2 - 1));
  pgVar6 = gravity_vm_fiber(vm);
  gravity_fiber_seterror(pgVar6,acStack_1038);
LAB_001293fb:
  gVar17.field_1.n = 0;
  gVar17.isa = gravity_class_null;
  gravity_vm_setslot(vm,gVar17,rindex);
  return false;
}

Assistant:

static bool string_loadat (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(nargs)
    gravity_string_t *string = VALUE_AS_STRING(GET_VALUE(0));
    gravity_value_t value = GET_VALUE(1);

    int32_t first_index;
    int32_t second_index;

    if (VALUE_ISA_INT(value)) {
        first_index = (int32_t)VALUE_AS_INT(value);
        second_index = first_index;
    }
    else if (VALUE_ISA_RANGE(value)) {
        gravity_range_t *range = VALUE_AS_RANGE(value);
        first_index = (int32_t)range->from;
        second_index = (int32_t)range->to;
    }
    else {
        RETURN_ERROR("An integer index or index range is required to access string items.");
    }

    if (first_index < 0) first_index = string->len + first_index;
    if ((first_index < 0) || ((uint32_t)first_index >= string->len)) RETURN_ERROR("Out of bounds error: first_index %d beyond bounds 0...%d", first_index, string->len-1);

    if (second_index < 0) second_index = string->len + second_index;
    if ((second_index < 0) || ((uint32_t)second_index >= string->len)) RETURN_ERROR("Out of bounds error: second_index %d beyond bounds 0...%d", second_index, string->len-1);

    uint32_t substr_len = first_index < second_index ? second_index - first_index + 1 : first_index - second_index + 1;

    bool is_forward = first_index <= second_index;
    if (!is_forward) {
        char *original = mem_alloc(vm, string->len);
        CHECK_MEM_ALLOC(original);

        // without copying it, we would be modifying the original string
        strncpy((char *)original, string->s, string->len);
        uint32_t original_len = (uint32_t) string->len;

        // Reverse the string, and reverse the indices
        first_index = original_len - first_index -1;

        // reverse the String
        int i = original_len - 1;
        int j = 0;
        char c;
        while (i > j) {
            c = original[i];
            original[i] = original[j];
            original[j] = c;
            --i;
            ++j;
        }

        gravity_value_t s = VALUE_FROM_STRING(vm, original + first_index, substr_len);
        mem_free(original);

        RETURN_VALUE(s, rindex);
    }
    RETURN_VALUE(VALUE_FROM_STRING(vm, string->s + first_index, substr_len), rindex);
}